

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestReserve(void)

{
  size_type sVar1;
  OutputBuffer *pOVar2;
  lazy_ostream *plVar3;
  element_type *peVar4;
  undefined8 local_380;
  undefined8 local_378;
  size_t reserveSize;
  OutputBuffer ob;
  lazy_ostream local_350;
  undefined8 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  const_string local_320;
  const_string local_310;
  char *local_300;
  char *local_2f8;
  const_string local_2f0;
  const_string local_2e0;
  char *local_2d0;
  char *local_2c8;
  const_string local_2c0;
  const_string local_2b0;
  char *local_2a0;
  char *local_298;
  const_string local_290;
  const_string local_280;
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  char *local_210;
  char *local_208;
  const_string local_200;
  const_string local_1f0;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0;
  char *local_1b0;
  char *local_1a8;
  const_string local_1a0;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  char *local_150;
  char *local_148;
  const_string local_140;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  ob.pimpl_.px = (element_type *)anon_var_dwarf_8f9cc;
  ob.pimpl_.pn.pi_ = (sp_counted_base *)0x1ba178;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&ob);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  reserveSize = CONCAT71(reserveSize._1_7_,1);
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea808;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "TestReserve";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&reserveSize,&local_350);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&reserveSize);
  pOVar2 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar2,0);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_40,0x46,&local_50);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_58 = "";
  reserveSize = (ob.pimpl_.px)->size_;
  local_378._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_60,0x46,1,2,&reserveSize,"ob.size()",&local_378,"0U");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_70,0x47,&local_80);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88 = "";
  reserveSize = (ob.pimpl_.px)->freeSpace_;
  local_378._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_90,0x47,1,2,&reserveSize,"ob.freeSpace()",&local_378,"0U");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_a0,0x48,&local_b0);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_b8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  reserveSize = CONCAT44(reserveSize._4_4_,(int)sVar1);
  local_378._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_c0,0x48,1,2,&reserveSize,"ob.numChunks()",&local_378,"0");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_d0,0x49,&local_e0);
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  reserveSize = CONCAT44(reserveSize._4_4_,(int)sVar1);
  local_378 = (ulong)local_378._4_4_ << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_350,&local_f0,0x49,1,2,&reserveSize,"ob.numDataChunks()",&local_378,"0");
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  reserveSize = 0x800;
  pOVar2 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar2,0x800);
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_100,0x50,&local_110);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_118 = "";
  local_378 = (ob.pimpl_.px)->size_;
  local_380._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_120,0x50,1,2,&local_378,"ob.size()",&local_380,"0U");
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_130,0x51,&local_140);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_148 = "";
  local_378 = (ob.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_150,0x51,1,2,&local_378,"ob.freeSpace()",&avro::detail::kMinBlockSize,
             "kMinBlockSize");
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_160,0x52,&local_170);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_178 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  local_380._0_4_ = 1;
  local_378._0_4_ = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_180,0x52,1,2,&local_378,"ob.numChunks()",&local_380,"1");
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_190.m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_190,0x53,&local_1a0);
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1a8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  local_378 = CONCAT44(local_378._4_4_,(int)sVar1);
  local_380._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_350,&local_1b0,0x53,1,2,&local_378,"ob.numDataChunks()",&local_380,"0");
  reserveSize = 0x2800;
  peVar4 = ob.pimpl_.px;
  avro::detail::BufferImpl::reserveFreeSpace(ob.pimpl_.px,0x2800);
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1c0.m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar4,&local_1c0,0x59,&local_1d0);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d8 = "";
  local_378 = (ob.pimpl_.px)->size_;
  local_380._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_1e0,0x59,1,2,&local_378,"ob.size()",&local_380,"0U");
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0.m_end = "";
  local_200.m_begin = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_1f0,0x5a,&local_200);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_208 = "";
  local_378 = (ob.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_210,0x5a,1,2,&local_378,"ob.freeSpace()",&reserveSize,"reserveSize");
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_220,0x5b,&local_230);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_238 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  local_380._0_4_ = 2;
  local_378._0_4_ = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_240,0x5b,1,2,&local_378,"ob.numChunks()",&local_380,"2");
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_250,0x5c,&local_260);
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_268 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  local_378 = CONCAT44(local_378._4_4_,(int)sVar1);
  local_380._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_350,&local_270,0x5c,1,2,&local_378,"ob.numDataChunks()",&local_380,"0");
  reserveSize = reserveSize + 0x4800;
  peVar4 = ob.pimpl_.px;
  avro::detail::BufferImpl::reserveFreeSpace(ob.pimpl_.px,reserveSize);
  local_280.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_280.m_end = "";
  local_290.m_begin = "";
  local_290.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar4,&local_280,99,&local_290);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_298 = "";
  local_378 = (ob.pimpl_.px)->size_;
  local_380 = (ulong)local_380._4_4_ << 0x20;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_2a0,99,1,2,&local_378,"ob.size()",&local_380,"0U");
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_2b0,100,&local_2c0);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2c8 = "";
  local_378 = (ob.pimpl_.px)->freeSpace_;
  local_380 = reserveSize + 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_2d0,100,1,2,&local_378,"ob.freeSpace()",&local_380,
             "reserveSize + kMinBlockSize/2");
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2e0.m_end = "";
  local_2f0.m_begin = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_2e0,0x65,&local_2f0);
  plVar3 = &local_350;
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2f8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  local_380._0_4_ = 4;
  local_378._0_4_ = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_300,0x65,1,2,&local_378,"ob.numChunks()",&local_380,"4");
  local_310.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_310.m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_310,0x66,&local_320);
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_328 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  local_378 = CONCAT44(local_378._4_4_,(int)sVar1);
  local_380 = (ulong)local_380._4_4_ << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_350,&local_330,0x66,1,2,&local_378,"ob.numDataChunks()",&local_380,"0");
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestReserve()
{
    BOOST_TEST_MESSAGE( "TestReserve");
    {
        OutputBuffer ob;
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(ob.numChunks(), 0);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }

    {
        size_t reserveSize = kMinBlockSize/2;

        OutputBuffer ob (reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kMinBlockSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);

        // reserve should add a single block
        reserveSize += 8192;

        ob.reserve(reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);

        // reserve should add two blocks, one of the maximum size and
        // one of the minimum size
        reserveSize += (kMaxBlockSize + kMinBlockSize/2);

        ob.reserve(reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize + kMinBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 4);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }
}